

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dataset.cpp
# Opt level: O3

vector<Matrix<double>,_std::allocator<Matrix<double>_>_> * __thiscall
DataSet::compile(vector<Matrix<double>,_std::allocator<Matrix<double>_>_> *__return_storage_ptr__,
                DataSet *this,uint n_output)

{
  uint end_col;
  pointer __s;
  Matrix<double> local_90;
  
  __s = (pointer)operator_new(0xc0);
  (__return_storage_ptr__->super__Vector_base<Matrix<double>,_std::allocator<Matrix<double>_>_>).
  _M_impl.super__Vector_impl_data._M_start = __s;
  (__return_storage_ptr__->super__Vector_base<Matrix<double>,_std::allocator<Matrix<double>_>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = __s + 2;
  memset(__s,0,0xc0);
  (__return_storage_ptr__->super__Vector_base<Matrix<double>,_std::allocator<Matrix<double>_>_>).
  _M_impl.super__Vector_impl_data._M_finish = __s + 2;
  Matrix<double>::compile(&local_90,&this->m_matrix,0,(this->m_matrix).m_shape.n_col - n_output);
  (__s->m_shape).is_diogonal = local_90.m_shape.is_diogonal;
  (__s->m_shape).n_row = local_90.m_shape.n_row;
  (__s->m_shape).n_col = local_90.m_shape.n_col;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::operator=(&__s->m_elems,&local_90.m_elems);
  __s->m_functions[6] = local_90.m_functions[6];
  __s->m_functions[4] = local_90.m_functions[4];
  __s->m_functions[5] = local_90.m_functions[5];
  __s->m_functions[2] = local_90.m_functions[2];
  __s->m_functions[3] = local_90.m_functions[3];
  __s->m_functions[0] = local_90.m_functions[0];
  __s->m_functions[1] = local_90.m_functions[1];
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_90.m_elems);
  end_col = (this->m_matrix).m_shape.n_col;
  Matrix<double>::compile(&local_90,&this->m_matrix,end_col - n_output,end_col);
  __s[1].m_shape.is_diogonal = local_90.m_shape.is_diogonal;
  __s[1].m_shape.n_row = local_90.m_shape.n_row;
  __s[1].m_shape.n_col = local_90.m_shape.n_col;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::operator=(&__s[1].m_elems,&local_90.m_elems);
  __s[1].m_functions[6] = local_90.m_functions[6];
  __s[1].m_functions[4] = local_90.m_functions[4];
  __s[1].m_functions[5] = local_90.m_functions[5];
  __s[1].m_functions[2] = local_90.m_functions[2];
  __s[1].m_functions[3] = local_90.m_functions[3];
  __s[1].m_functions[0] = local_90.m_functions[0];
  __s[1].m_functions[1] = local_90.m_functions[1];
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_90.m_elems);
  return __return_storage_ptr__;
}

Assistant:

std::vector<Matrix_d> DataSet::compile(unsigned n_output) const{
    std::vector<Matrix_d> matrices(2);
    
    matrices[0]=m_matrix.compile(0, m_matrix.shape().n_col-n_output);
    matrices[1]=m_matrix.compile(m_matrix.shape().n_col-n_output, m_matrix.shape().n_col);

    return matrices;
}